

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

bool __thiscall
slang::ast::ValueExpressionBase::checkConstantBase(ValueExpressionBase *this,EvalContext *context)

{
  not_null<const_slang::ast::Type_*> *this_00;
  bool bVar1;
  Type *pTVar2;
  DiagCode code;
  
  this_00 = &(this->super_Expression).type;
  pTVar2 = not_null<const_slang::ast::Type_*>::get(this_00);
  bVar1 = Type::isClass(pTVar2);
  code.subsystem = ConstEval;
  code.code = 5;
  if (!bVar1) {
    pTVar2 = not_null<const_slang::ast::Type_*>::get(this_00);
    bVar1 = Type::isCovergroup(pTVar2);
    code.subsystem = ConstEval;
    code.code = 6;
    if (!bVar1) {
      if ((this->symbol->super_Symbol).kind != Specparam) {
        return true;
      }
      code.subsystem = Expressions;
      code.code = 0x86;
      if (((context->flags).m_bits & 4) != 0) {
        return true;
      }
    }
  }
  EvalContext::addDiag(context,code,(this->super_Expression).sourceRange);
  return false;
}

Assistant:

bool ValueExpressionBase::checkConstantBase(EvalContext& context) const {
    // Class types are disallowed in constant expressions. Note that I don't see anything
    // in the spec that would explicitly disallow them, but literally every tool issues
    // an error so for now we will follow suit.
    if (type->isClass()) {
        context.addDiag(diag::ConstEvalClassType, sourceRange);
        return false;
    }

    // Same for covergroups.
    if (type->isCovergroup()) {
        context.addDiag(diag::ConstEvalCovergroupType, sourceRange);
        return false;
    }

    if (symbol.kind == SymbolKind::Specparam && !context.flags.has(EvalFlags::SpecparamsAllowed)) {
        context.addDiag(diag::SpecparamInConstant, sourceRange);
        return false;
    }

    return true;
}